

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderIncompleteProgramObjectsTest::initTestRuns
          (GeometryShaderIncompleteProgramObjectsTest *this)

{
  _run local_1c;
  _run local_19;
  _run local_16;
  _run local_13;
  GeometryShaderIncompleteProgramObjectsTest *local_10;
  GeometryShaderIncompleteProgramObjectsTest *this_local;
  
  local_10 = this;
  _run::_run(&local_13,false,true,false);
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::push_back(&this->m_test_runs,&local_13);
  _run::_run(&local_16,false,true,true);
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::push_back(&this->m_test_runs,&local_16);
  _run::_run(&local_19,true,true,false);
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::push_back(&this->m_test_runs,&local_19);
  _run::_run(&local_1c,true,true,true);
  std::
  vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
  ::push_back(&this->m_test_runs,&local_1c);
  return;
}

Assistant:

void GeometryShaderIncompleteProgramObjectsTest::initTestRuns()
{
	/*                         use_fs| use_gs| use_separable_po
	 *                         ------|-------|-----------------*/
	m_test_runs.push_back(_run(false, true, false));
	m_test_runs.push_back(_run(false, true, true));
	m_test_runs.push_back(_run(true, true, false));
	m_test_runs.push_back(_run(true, true, true));
}